

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

void Cba_NtkAddMissingFonNames(Cba_Ntk_t *p,char *pPref)

{
  int iVar1;
  uint local_24;
  int local_20;
  int Index;
  int NameId;
  int iFon;
  char *pPref_local;
  Cba_Ntk_t *p_local;
  
  Cba_ManCleanMap(p->pDesign);
  for (Index = 1; iVar1 = Vec_IntSize(&p->vFonName), Index < iVar1; Index = Index + 1) {
    iVar1 = Vec_IntEntry(&p->vFonName,Index);
    if (iVar1 != 0) {
      Cba_ManSetMap(p->pDesign,iVar1,Index);
    }
  }
  for (Index = 1; iVar1 = Vec_IntSize(&p->vFonName), Index < iVar1; Index = Index + 1) {
    iVar1 = Vec_IntEntry(&p->vFonName,Index);
    if (iVar1 == 0) {
      local_20 = Cba_NtkNewStrId(p,"%s%d",pPref,(ulong)(uint)Index);
      local_24 = 1;
      while (iVar1 = Cba_ManGetMap(p->pDesign,local_20), iVar1 != 0) {
        local_20 = Cba_NtkNewStrId(p,"%s%d_%d",pPref,(ulong)(uint)Index,(ulong)local_24);
        local_24 = local_24 + 1;
      }
      Cba_FonSetName(p,Index,local_20);
      Cba_ManSetMap(p->pDesign,local_20,Index);
    }
  }
  return;
}

Assistant:

static inline void Cba_NtkAddMissingFonNames( Cba_Ntk_t * p, char * pPref )
{
    int iFon, NameId, Index;
    // populate map
    Cba_ManCleanMap( p->pDesign );
    Vec_IntForEachEntryStart( &p->vFonName, NameId, iFon, 1 )
        if ( NameId )
            Cba_ManSetMap( p->pDesign, NameId, iFon );
    // check remaining ones
    Vec_IntForEachEntryStart( &p->vFonName, NameId, iFon, 1 )
    {
        if ( NameId )
            continue;
        NameId = Cba_NtkNewStrId(p, "%s%d", pPref, iFon);
        for ( Index = 1; Cba_ManGetMap(p->pDesign, NameId); Index++ )
            NameId = Cba_NtkNewStrId(p, "%s%d_%d", pPref, iFon, Index);
        Cba_FonSetName( p, iFon, NameId );
        Cba_ManSetMap( p->pDesign, NameId, iFon );
    }
}